

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::DoubleToBuffer(double value,char *buffer)

{
  uint uVar1;
  char *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int snprintf_result_1;
  double parsed_value;
  int snprintf_result;
  char *in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  
  dVar2 = std::numeric_limits<double>::infinity();
  if ((in_XMM0_Qa != dVar2) || (NAN(in_XMM0_Qa) || NAN(dVar2))) {
    dVar2 = std::numeric_limits<double>::infinity();
    if ((in_XMM0_Qa != -dVar2) || (NAN(in_XMM0_Qa) || NAN(-dVar2))) {
      uVar1 = std::isnan(in_XMM0_Qa);
      if ((uVar1 & 1) == 0) {
        snprintf(in_RDI,0x20,"%.*g",in_XMM0_Qa,0xf);
        dVar2 = internal::NoLocaleStrtod(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if ((dVar2 != in_XMM0_Qa) || (NAN(dVar2) || NAN(in_XMM0_Qa))) {
          snprintf(in_RDI,0x20,"%.*g",in_XMM0_Qa,0x11);
        }
        DelocalizeRadix(in_stack_ffffffffffffff20);
      }
      else {
        strcpy(in_RDI,"nan");
      }
    }
    else {
      strcpy(in_RDI,"-inf");
    }
  }
  else {
    strcpy(in_RDI,"inf");
  }
  return in_RDI;
}

Assistant:

char* DoubleToBuffer(double value, char* buffer) {
  // DBL_DIG is 15 for IEEE-754 doubles, which are used on almost all
  // platforms these days.  Just in case some system exists where DBL_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  GOOGLE_COMPILE_ASSERT(DBL_DIG < 20, DBL_DIG_is_too_big);

  if (value == std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);

  // We need to make parsed_value volatile in order to force the compiler to
  // write it out to the stack.  Otherwise, it may keep the value in a
  // register, and if it does that, it may keep it as a long double instead
  // of a double.  This long double may have extra bits that make it compare
  // unequal to "value" even though it would be exactly equal if it were
  // truncated to a double.
  volatile double parsed_value = internal::NoLocaleStrtod(buffer, nullptr);
  if (parsed_value != value) {
    int snprintf_result =
      snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG+2, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}